

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlElement::CopyTo(TiXmlElement *this,TiXmlElement *target)

{
  int iVar1;
  char *cname;
  char *cvalue;
  undefined4 extraout_var;
  TiXmlNode *local_28;
  TiXmlNode *node;
  TiXmlAttribute *attribute;
  TiXmlElement *target_local;
  TiXmlElement *this_local;
  
  TiXmlNode::CopyTo(&this->super_TiXmlNode,&target->super_TiXmlNode);
  for (node = (TiXmlNode *)TiXmlAttributeSet::First(&this->attributeSet); node != (TiXmlNode *)0x0;
      node = (TiXmlNode *)TiXmlAttribute::Next((TiXmlAttribute *)node)) {
    cname = TiXmlAttribute::Name((TiXmlAttribute *)node);
    cvalue = TiXmlAttribute::Value((TiXmlAttribute *)node);
    SetAttribute(target,cname,cvalue);
  }
  for (local_28 = (this->super_TiXmlNode).firstChild; local_28 != (TiXmlNode *)0x0;
      local_28 = TiXmlNode::NextSibling(local_28)) {
    iVar1 = (*(local_28->super_TiXmlBase)._vptr_TiXmlBase[0x10])();
    TiXmlNode::LinkEndChild(&target->super_TiXmlNode,(TiXmlNode *)CONCAT44(extraout_var,iVar1));
  }
  return;
}

Assistant:

void TiXmlElement::CopyTo(TiXmlElement* target) const {
	// superclass:
	TiXmlNode::CopyTo(target);

	// Element class:
	// Clone the attributes, then clone the children.
	const TiXmlAttribute* attribute = 0;
	for (attribute = attributeSet.First(); attribute;
		attribute = attribute->Next()) {
		target->SetAttribute(attribute->Name(), attribute->Value());
	}

	TiXmlNode* node = 0;
	for (node = firstChild; node; node = node->NextSibling()) {
		target->LinkEndChild(node->Clone());
	}
}